

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_maps.h
# Opt level: O0

vec3 __thiscall polyscope::render::ValueColorMap::getValue(ValueColorMap *this,double val)

{
  double dVar1;
  vec3 vVar2;
  bool bVar3;
  uint uVar4;
  size_type sVar5;
  long in_RDI;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *this_00;
  float fVar6;
  double in_XMM0_Qa;
  vec<3,_float,_(glm::qualifier)0> *v;
  undefined1 auVar10 [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  vec<3,_float,_(glm::qualifier)0> vVar14;
  uint upperInd;
  uint lowerInd;
  double upperBlendVal;
  double lowerVal;
  double scaledVal;
  double in_stack_ffffffffffffff28;
  double in_stack_ffffffffffffff30;
  vec<3,_float,_(glm::qualifier)0> *v2;
  undefined4 in_stack_ffffffffffffff40;
  undefined8 local_c;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_4;
  
  bVar3 = std::isfinite(in_XMM0_Qa);
  if (bVar3) {
    auVar12 = ZEXT816(0x3ff0000000000000);
    v2 = (vec<3,_float,_(glm::qualifier)0> *)0x3ff0000000000000;
    v = (vec<3,_float,_(glm::qualifier)0> *)
        glm::clamp<double>(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,1.99617491108933e-317
                          );
    this_00 = (vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               *)(in_RDI + 0x20);
    sVar5 = std::
            vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            ::size(this_00);
    auVar12 = vcvtusi2sd_avx512f(auVar12,sVar5 - 1);
    dVar1 = (double)v * auVar12._0_8_;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar1;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar1;
    auVar11 = vroundsd_avx(auVar11,auVar13,9);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = auVar11._0_8_;
    uVar4 = vcvttsd2usi_avx512f(auVar12);
    fVar6 = (float)((double)v2 - (dVar1 - auVar11._0_8_));
    std::
    vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ::operator[](this_00,(ulong)uVar4);
    auVar10 = (undefined1  [56])0x0;
    vVar14 = glm::operator*(SUB84(v2,0),v);
    auVar7._0_8_ = vVar14._0_8_;
    auVar7._8_56_ = auVar10;
    vmovlpd_avx(auVar7._0_16_);
    std::
    vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ::operator[](this_00,(ulong)(uVar4 + 1));
    auVar10 = (undefined1  [56])0x0;
    vVar14 = glm::operator*(SUB84(v2,0),v);
    auVar8._0_8_ = vVar14._0_8_;
    auVar8._8_56_ = auVar10;
    vmovlpd_avx(auVar8._0_16_);
    vVar14 = glm::operator+((vec<3,_float,_(glm::qualifier)0> *)
                            CONCAT44(fVar6,in_stack_ffffffffffffff40),v2);
    local_4 = vVar14.field_2;
    auVar9._0_8_ = vVar14._0_8_;
    auVar9._8_56_ = auVar10;
    local_c = vmovlpd_avx(auVar9._0_16_);
  }
  else {
    glm::vec<3,float,(glm::qualifier)0>::vec<int,int,int>
              ((vec<3,float,(glm::qualifier)0> *)&local_c,0,0,0);
  }
  vVar2.field_2 = local_4;
  vVar2.field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(undefined4)local_c;
  vVar2.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_c._4_4_;
  return vVar2;
}

Assistant:

glm::vec3 getValue(double val) const {
    if (!std::isfinite(val)) {
      return {0, 0, 0};
    }

    val = glm::clamp(val, 0.0, 1.0);

    // Find the two nearest indices in to the colormap lookup table, then
    // return a linear blend between them.
    double scaledVal = val * (values.size() - 1);
    double lowerVal = std::floor(scaledVal);
    double upperBlendVal = scaledVal - lowerVal;
    unsigned int lowerInd = static_cast<unsigned int>(lowerVal);
    unsigned int upperInd = lowerInd + 1;

    return (float)(1.0 - upperBlendVal) * values[lowerInd] + (float)upperBlendVal * values[upperInd];
  }